

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetQuantity
          (FXBase *this,string *key,double qty)

{
  FX *pFVar1;
  InvalidSubjectException *this_00;
  string qty_string;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 2;
  if (0.0 < qty) {
    std::ostream::_M_insert<double>(qty);
    std::__cxx11::stringbuf::str();
    pFVar1 = this->outer_class_;
    std::__cxx11::stringbuf::str();
    SubjectBuilder::SetComponent
              (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,key,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"dealt quantity must be a positive value: ",0x29);
  std::ostream::_M_insert<double>(qty);
  this_00 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  InvalidSubjectException::InvalidSubjectException(this_00,&local_1e8);
  __cxa_throw(this_00,&InvalidSubjectException::typeinfo,
              InvalidSubjectException::~InvalidSubjectException);
}

Assistant:

void SubjectFactory::FX::FXBase::SetQuantity(const std::string& key, double qty)
{
    std::stringstream ss;

    if (qty <= 0)
    {
        ss << std::fixed << std::setprecision(2) << "dealt quantity must be a positive value: " << qty;
        throw InvalidSubjectException(ss.str());
    }

    ss << std::fixed << std::setprecision(2) << qty;

    std::string qty_string = ss.str();

    outer_class_.subject_builder_.SetComponent(key, ss.str());
}